

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

char * __thiscall
google::protobuf::ServiceOptions::_InternalParse(ServiceOptions *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  byte bVar2;
  int iVar3;
  Rep *pRVar4;
  bool bVar5;
  UninterpretedOption *msg;
  byte *pbVar6;
  uint uVar7;
  uint32 uVar8;
  uint uVar9;
  UnknownFieldSet *unknown;
  char cVar10;
  ulong tag;
  pair<const_char_*,_unsigned_int> pVar11;
  pair<const_char_*,_unsigned_long> pVar12;
  uint local_3c;
  byte *local_38;
  char *ptr_local;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  local_3c = 0;
  local_38 = (byte *)ptr;
  do {
    bVar5 = internal::EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    if (bVar5) goto LAB_002a94c5;
    bVar1 = *local_38;
    pVar11.second._0_1_ = bVar1;
    pVar11.first = (char *)(local_38 + 1);
    pVar11._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = local_38[1];
      uVar8 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar11 = internal::ReadTagFallback((char *)local_38,uVar8);
      }
      else {
        pVar11.second = uVar8;
        pVar11.first = (char *)(local_38 + 2);
        pVar11._12_4_ = 0;
      }
    }
    local_38 = (byte *)pVar11.first;
    cVar10 = '\x04';
    if (local_38 != (byte *)0x0) {
      uVar9 = pVar11.second;
      uVar7 = (uint)(pVar11._8_8_ >> 3) & 0x1fffffff;
      if (uVar7 == 999) {
        if ((char)pVar11.second != ':') goto LAB_002a93da;
        local_38 = local_38 + -2;
        do {
          local_38 = local_38 + 2;
          pRVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar4 == (Rep *)0x0) {
LAB_002a9363:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,
                       (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002a9370:
            pRVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
            pRVar4->allocated_size = pRVar4->allocated_size + 1;
            msg = Arena::CreateMaybeMessage<google::protobuf::UninterpretedOption>
                            ((this->uninterpreted_option_).super_RepeatedPtrFieldBase.arena_);
            pRVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
            iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
            (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            pRVar4->elements[iVar3] = msg;
          }
          else {
            iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar4->allocated_size <= iVar3) {
              if (pRVar4->allocated_size ==
                  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_002a9363;
              goto LAB_002a9370;
            }
            (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            msg = (UninterpretedOption *)pRVar4->elements[iVar3];
          }
          local_38 = (byte *)internal::ParseContext::
                             ParseMessage<google::protobuf::UninterpretedOption>
                                       (ctx,msg,(char *)local_38);
          if (local_38 == (byte *)0x0) goto LAB_002a949d;
        } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) &&
                (*(short *)local_38 == 0x3eba));
        cVar10 = '\x02';
      }
      else if ((uVar7 == 0x21) && ((char)pVar11.second == '\b')) {
        bVar1 = *local_38;
        pVar12.second = (long)(char)bVar1;
        pVar12.first = (char *)local_38;
        pbVar6 = local_38 + 1;
        if ((long)(char)bVar1 < 0) {
          uVar8 = ((uint)*pbVar6 * 0x80 + (uint)bVar1) - 0x80;
          if ((char)*pbVar6 < '\0') {
            pVar12 = internal::VarintParseSlow64((char *)local_38,uVar8);
          }
          else {
            pVar12.second._0_4_ = uVar8;
            pVar12.first = (char *)(local_38 + 2);
            pVar12.second._4_4_ = 0;
          }
          pbVar6 = (byte *)pVar12.first;
        }
        this->deprecated_ = pVar12.second != 0;
        cVar10 = (pbVar6 == (byte *)0x0) * '\x02' + '\x02';
        local_3c = 1;
        local_38 = pbVar6;
      }
      else {
LAB_002a93da:
        if (uVar9 == 0 || (uVar9 & 7) == 4) {
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar9 - 1;
          cVar10 = '\t';
        }
        else {
          tag = pVar11._8_8_ & 0xffffffff;
          if (uVar9 < 8000) {
            if (((ulong)this_00->ptr_ & 1) == 0) {
              unknown = internal::InternalMetadata::
                        mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
            }
            else {
              unknown = (UnknownFieldSet *)(((ulong)this_00->ptr_ & 0xfffffffffffffffe) + 8);
            }
            local_38 = (byte *)internal::UnknownFieldParse(tag,unknown,(char *)local_38,ctx);
          }
          else {
            local_38 = (byte *)internal::ExtensionSet::ParseField
                                         (&this->_extensions_,tag,(char *)local_38,
                                          (Message *)_ServiceOptions_default_instance_,this_00,ctx);
          }
          cVar10 = (local_38 == (byte *)0x0) * '\x02' + '\x02';
        }
      }
    }
LAB_002a949d:
  } while (cVar10 == '\x02');
  if (cVar10 == '\x04') {
    local_38 = (byte *)0x0;
  }
LAB_002a94c5:
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | local_3c;
  return (char *)local_38;
}

Assistant:

const char* ServiceOptions::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional bool deprecated = 33 [default = false];
      case 33:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8)) {
          _Internal::set_has_deprecated(&has_bits);
          deprecated_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_uninterpreted_option(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<7994>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((8000u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}